

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O3

Node * __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::buildKDTree
          (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,
          vector<P_*,_std::allocator<P_*>_> *values,uint depth)

{
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> _Var1;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> __last;
  P *pPVar2;
  pointer ppPVar3;
  Node *node;
  Node *pNVar4;
  Node *pNVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 local_78 [8];
  vector<P_*,_std::allocator<P_*>_> rightValues;
  vector<P_*,_std::allocator<P_*>_> leftValues;
  allocator_type local_35;
  uint local_34 [2];
  uint depth_local;
  
  _Var1._M_current =
       (values->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (values->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar7 = (uint)((long)__last._M_current - (long)_Var1._M_current >> 3);
  local_34[0] = depth;
  if (uVar7 == 1) {
    node = (Node *)operator_new(0x18);
    pPVar2 = *_Var1._M_current;
    node->left = (Node *)0x0;
    node->right = (Node *)0x0;
    node->value = pPVar2;
  }
  else if ((int)uVar7 < 1) {
    node = (Node *)0x0;
  }
  else {
    uVar8 = (ulong)(uVar7 >> 1 & 0x3fffffff);
    rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_34;
    std::
    __heap_select<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kdtree::KDTree<P,3u,P_new,P_delete,P_set,P_less>::buildKDTree(std::vector<P*,std::allocator<P*>>&,unsigned_int)::_lambda(P*,P*)_1_>>
              (_Var1,(__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
                     (_Var1._M_current + uVar8 + 1),__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_schenker[P]KDTree_KDTree_hpp:81:6)>
                )rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::
    __sort_heap<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kdtree::KDTree<P,3u,P_new,P_delete,P_set,P_less>::buildKDTree(std::vector<P*,std::allocator<P*>>&,unsigned_int)::_lambda(P*,P*)_1_>>
              (_Var1,(__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
                     (_Var1._M_current + uVar8 + 1),
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_schenker[P]KDTree_KDTree_hpp:81:6)>
                *)&rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    _Var1._M_current =
         (values->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    std::vector<P*,std::allocator<P*>>::
    vector<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
              ((vector<P*,std::allocator<P*>> *)
               &rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,_Var1,
               (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
               (_Var1._M_current + uVar8),(allocator_type *)local_78);
    std::vector<P*,std::allocator<P*>>::
    vector<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
              ((vector<P*,std::allocator<P*>> *)local_78,
               (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
               ((values->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar8),
               (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
               (values->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_35);
    pNVar4 = buildKDTree(this,(vector<P_*,_std::allocator<P_*>_> *)
                              &rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,local_34[0] + 1);
    pNVar5 = buildKDTree(this,(vector<P_*,_std::allocator<P_*>_> *)local_78,local_34[0] + 1);
    node = (Node *)operator_new(0x18);
    ppPVar3 = (values->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(values->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3) <= uVar8) {
      uVar6 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar8);
      operator_delete(node);
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78);
      }
      if (rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      _Unwind_Resume(uVar6);
    }
    pPVar2 = ppPVar3[uVar8];
    node->left = pNVar4;
    node->right = pNVar5;
    node->value = pPVar2;
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78);
    }
    if (rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete(rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  updateBoundingBox(this,node);
  return node;
}

Assistant:

Node *buildKDTree(std::vector<T*> &values, const unsigned int depth = 0) {
			Node *result;

			const int numberOfValues = values.size();

			if (numberOfValues == 1) {
				result = new Node(values.front());
			}
			else if (numberOfValues > 0) {

				std::partial_sort(values.begin(), values.begin() + (numberOfValues / 2) + 1, values.end(),
					[&depth](T *i, T *j) {
					return LESS()(i, j, depth%dim);
				});

				const int pivot = numberOfValues / 2;

				std::vector<T*> leftValues(values.begin(), values.begin() + pivot);
				std::vector<T*> rightValues(values.begin() + pivot, values.end());

				Node *leftNode = buildKDTree(leftValues, depth + 1);
				Node *rightNode = buildKDTree(rightValues, depth + 1);

				result = new Node(values.at(pivot), leftNode, rightNode);
			}
			else { // values.empty()
				result = 0;
			}

			updateBoundingBox(result);

			return result;
		}